

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_common.c
# Opt level: O0

char * buffer_reserve(Buffer *buffer,size_t len)

{
  ulong uVar1;
  BufferBlock *pBVar2;
  ulong local_60;
  ulong local_58;
  BufferBlock *item;
  size_t malloc_len;
  size_t bytecount;
  size_t avail;
  size_t tailbytes;
  size_t blocksize;
  size_t len_local;
  Buffer *buffer_local;
  
  local_60 = buffer->block_size;
  if (len == 0) {
    buffer_local = (Buffer *)0x0;
  }
  else {
    if (buffer->tail != (BufferBlock *)0x0) {
      uVar1 = buffer->tail->bytes;
      if (uVar1 < local_60) {
        local_58 = local_60 - uVar1;
      }
      else {
        local_58 = 0;
      }
      if (len <= local_58) {
        buffer->tail->bytes = len + buffer->tail->bytes;
        buffer->total_bytes = len + buffer->total_bytes;
        if (buffer->tail->bytes <= local_60) {
          return (char *)(buffer->tail->data + uVar1);
        }
        __assert_fail("buffer->tail->bytes <= blocksize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_common.c"
                      ,0x2cf,"char *buffer_reserve(Buffer *, const size_t)");
      }
    }
    if (local_60 < len) {
      local_60 = len;
    }
    pBVar2 = (BufferBlock *)(*buffer->m)((int)local_60 + 0x18,buffer->d);
    if (pBVar2 == (BufferBlock *)0x0) {
      buffer_local = (Buffer *)0x0;
    }
    else {
      pBVar2->data = (uint8 *)(pBVar2 + 1);
      pBVar2->bytes = len;
      pBVar2->next = (BufferBlock *)0x0;
      if (buffer->tail == (BufferBlock *)0x0) {
        buffer->head = pBVar2;
      }
      else {
        buffer->tail->next = pBVar2;
      }
      buffer->tail = pBVar2;
      buffer->total_bytes = len + buffer->total_bytes;
      buffer_local = (Buffer *)pBVar2->data;
    }
  }
  return (char *)buffer_local;
}

Assistant:

char *buffer_reserve(Buffer *buffer, const size_t len)
{
    // note that we make the blocks bigger than blocksize when we have enough
    //  data to overfill a fresh block, to reduce allocations.
    const size_t blocksize = buffer->block_size;

    if (len == 0)
        return NULL;

    if (buffer->tail != NULL)
    {
        const size_t tailbytes = buffer->tail->bytes;
        const size_t avail = (tailbytes >= blocksize) ? 0 : blocksize - tailbytes;
        if (len <= avail)
        {
            buffer->tail->bytes += len;
            buffer->total_bytes += len;
            assert(buffer->tail->bytes <= blocksize);
            return (char *) buffer->tail->data + tailbytes;
        } // if
    } // if

    // need to allocate a new block (even if a previous block wasn't filled,
    //  so this buffer is contiguous).
    const size_t bytecount = len > blocksize ? len : blocksize;
    const size_t malloc_len = sizeof (BufferBlock) + bytecount;
    BufferBlock *item = (BufferBlock *) buffer->m(malloc_len, buffer->d);
    if (item == NULL)
        return NULL;

    item->data = ((uint8 *) item) + sizeof (BufferBlock);
    item->bytes = len;
    item->next = NULL;
    if (buffer->tail != NULL)
        buffer->tail->next = item;
    else
        buffer->head = item;
    buffer->tail = item;

    buffer->total_bytes += len;

    return (char *) item->data;
}